

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

bool __thiscall restincurl::Worker::EvaluateState(Worker *this,bool transfersRunning,bool doDequeue)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  byte bVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Run loop: transfers_running=",0x1c);
    poVar2 = std::ostream::_M_insert<bool>(false);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", do_dequeue=",0xd);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", close_pending_=",0x11);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar4 = this->abort_;
    if (!transfersRunning && (bool)bVar4 == false) {
      bVar4 = this->close_pending_;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return (bool)(bVar4 ^ 1);
  }
  uVar3 = std::__throw_system_error(iVar1);
  __clang_call_terminate(uVar3);
}

Assistant:

bool EvaluateState(const bool transfersRunning, const bool doDequeue) const noexcept {
            lock_t lock(mutex_);

            RESTINCURL_LOG_TRACE("Run loop: transfers_running=" << transfersRunning
                << ", do_dequeue=" << doDequeue
                << ", close_pending_=" << close_pending_);

            return !abort_ && (transfersRunning || !close_pending_);
        }